

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

void __thiscall embree::CoronaLoader::loadMapDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *prVar3;
  mapped_type *pmVar4;
  long *in_RSI;
  string *in_RDI;
  shared_ptr<embree::Texture> texture;
  string name;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  shared_ptr<embree::Texture> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  key_type *in_stack_fffffffffffffe98;
  XML *in_stack_fffffffffffffea8;
  allocator local_141;
  string local_140 [32];
  string local_120 [39];
  undefined1 local_f9;
  ParseLocation *in_stack_ffffffffffffff08;
  string local_d8 [35];
  undefined1 local_b5;
  string local_68 [32];
  long *local_48;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_48 = in_RSI;
  bVar1 = std::operator!=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    local_b5 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_10 = local_48;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff08);
    std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
    local_18 = local_48;
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::runtime_error::runtime_error(prVar3,local_68);
    local_b5 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20 = local_48;
  sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                    ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(*local_48 + 0x80));
  if (sVar2 == 1) {
    local_30 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"name",&local_141);
    XML::parm(in_stack_fffffffffffffea8,in_RDI);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    local_38 = local_48;
    this_00 = (shared_ptr<embree::Texture> *)*local_48;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (this_00 + 8),0);
    loadMap((CoronaLoader *)name.field_2._M_allocated_capacity,
            (Ref<embree::XML> *)name._M_string_length);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xfffffffffffffea8);
    if (bVar1) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                             *)in_RDI,in_stack_fffffffffffffe98);
      std::shared_ptr<embree::Texture>::operator=(this_00,pmVar4);
    }
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x41072b);
    std::__cxx11::string::~string(local_120);
    return;
  }
  local_f9 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_28 = local_48;
  ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff08);
  std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  std::runtime_error::runtime_error(prVar3,local_d8);
  local_f9 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoronaLoader::loadMapDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "mapDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid map definition");

    const std::string name = xml->parm("name");
    std::shared_ptr<Texture> texture = loadMap(xml->children[0]);
    if (texture) textureMap[name] = texture;
  }